

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreMaterial.cpp
# Opt level: O0

void __thiscall
Assimp::Ogre::OgreImporter::ReadMaterials
          (OgreImporter *this,string *pFile,IOSystem *pIOHandler,aiScene *pScene,MeshXml *mesh)

{
  ulong uVar1;
  size_type sVar2;
  aiMaterial *local_78;
  aiMaterial *material;
  SubMeshXml *submesh;
  ulong local_58;
  size_t len;
  size_t i;
  vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> materials;
  MeshXml *mesh_local;
  aiScene *pScene_local;
  IOSystem *pIOHandler_local;
  string *pFile_local;
  OgreImporter *this_local;
  
  materials.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)mesh;
  std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::vector
            ((vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> *)&i);
  len = 0;
  local_58 = MeshXml::NumSubMeshes
                       ((MeshXml *)
                        materials.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
  for (; len < local_58; len = len + 1) {
    material = (aiMaterial *)
               MeshXml::GetSubMesh((MeshXml *)
                                   materials.
                                   super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage,(uint16_t)len);
    if ((((SubMeshXml *)material != (SubMeshXml *)0x0) &&
        (uVar1 = std::__cxx11::string::empty(), (uVar1 & 1) == 0)) &&
       (local_78 = ReadMaterial(this,pFile,pIOHandler,(string *)&material[2].mNumProperties),
       local_78 != (aiMaterial *)0x0)) {
      sVar2 = std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::size
                        ((vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> *)&i);
      material[8].mNumProperties = (uint)sVar2;
      std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::push_back
                ((vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> *)&i,&local_78);
    }
  }
  AssignMaterials(this,pScene,(vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> *)&i);
  std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::~vector
            ((vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> *)&i);
  return;
}

Assistant:

void OgreImporter::ReadMaterials(const std::string &pFile, Assimp::IOSystem *pIOHandler, aiScene *pScene, MeshXml *mesh)
{
    std::vector<aiMaterial*> materials;

    // Create materials that can be found and parsed via the IOSystem.
    for (size_t i=0, len=mesh->NumSubMeshes(); i<len; ++i)
    {
        SubMeshXml *submesh = mesh->GetSubMesh( static_cast<uint16_t>(i));
        if (submesh && !submesh->materialRef.empty())
        {
            aiMaterial *material = ReadMaterial(pFile, pIOHandler, submesh->materialRef);
            if (material)
            {
                submesh->materialIndex = static_cast<int>(materials.size());
                materials.push_back(material);
            }
        }
    }

    AssignMaterials(pScene, materials);
}